

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::SetScriptModeFile(cmMakefile *this,char *scriptfile)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CMAKE_SCRIPT_MODE_FILE",&local_39);
  AddDefinition(this,&local_38,scriptfile);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmMakefile::SetScriptModeFile(const char* scriptfile)
{
  this->AddDefinition("CMAKE_SCRIPT_MODE_FILE", scriptfile);
}